

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int biseq(bstring b0,bstring b1)

{
  uchar *__s1;
  uchar *__s2;
  uint uVar1;
  int iVar2;
  
  uVar1 = 0xffffffff;
  if (((b1 != (bstring)0x0 && b0 != (bstring)0x0) && (__s1 = b0->data, __s1 != (uchar *)0x0)) &&
     (__s2 = b1->data, __s2 != (uchar *)0x0)) {
    iVar2 = b0->slen;
    if (((-1 < (long)iVar2) && (-1 < b1->slen)) &&
       ((uVar1 = 0, iVar2 == b1->slen && (uVar1 = 1, iVar2 != 0 && __s1 != __s2)))) {
      iVar2 = bcmp(__s1,__s2,(long)iVar2);
      uVar1 = (uint)(iVar2 == 0);
    }
  }
  return uVar1;
}

Assistant:

int biseq (const bstring b0, const bstring b1) {
	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return BSTR_ERR;
	if (b0->slen != b1->slen) return 0;
	if (b0->data == b1->data || b0->slen == 0) return 1;
	return !memcmp (b0->data, b1->data, b0->slen);
}